

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O0

void __thiscall Vector::Scale(Vector *this,float scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float z;
  float y;
  float x;
  float scale_local;
  Vector *this_local;
  
  fVar1 = X(this);
  fVar2 = Y(this);
  fVar3 = Z(this);
  Set(this,fVar1 * scale,fVar2 * scale,fVar3 * scale);
  return;
}

Assistant:

void Vector::Scale(float scale)
{
   float x, y, z;

   x = X() * scale;
   y = Y() * scale;
   z = Z() * scale;

   Set(x, y, z);
}